

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

void __thiscall
CS248::StaticScene::InfiniteHemisphereLight::InfiniteHemisphereLight
          (InfiniteHemisphereLight *this,Spectrum *rad)

{
  Vector3D *pVVar1;
  undefined8 *in_RSI;
  SceneLight *in_RDI;
  double local_58;
  Matrix3x3 *in_stack_ffffffffffffffb0;
  double local_48;
  Vector3D local_40;
  Vector3D local_28;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  SceneLight::SceneLight(in_RDI);
  in_RDI->_vptr_SceneLight = (_func_int **)&PTR_is_delta_light_00301fd8;
  in_RDI[1]._vptr_SceneLight = (_func_int **)*local_10;
  *(undefined4 *)&in_RDI[2]._vptr_SceneLight = *(undefined4 *)(local_10 + 1);
  Matrix3x3::Matrix3x3(in_stack_ffffffffffffffb0);
  Vector3D::Vector3D(&local_28,1.0,0.0,0.0);
  pVVar1 = Matrix3x3::operator[]((Matrix3x3 *)(in_RDI + 3),0);
  pVVar1->x = local_28.x;
  pVVar1->y = local_28.y;
  pVVar1->z = local_28.z;
  Vector3D::Vector3D(&local_40,0.0,0.0,-1.0);
  pVVar1 = Matrix3x3::operator[]((Matrix3x3 *)(in_RDI + 3),1);
  pVVar1->x = local_40.x;
  pVVar1->y = local_40.y;
  pVVar1->z = local_40.z;
  Vector3D::Vector3D((Vector3D *)&local_58,0.0,1.0,0.0);
  pVVar1 = Matrix3x3::operator[]((Matrix3x3 *)(in_RDI + 3),2);
  pVVar1->x = local_58;
  pVVar1->y = (double)in_stack_ffffffffffffffb0;
  pVVar1->z = local_48;
  return;
}

Assistant:

InfiniteHemisphereLight::InfiniteHemisphereLight(const Spectrum& rad)
    : radiance(rad) {
  sampleToWorld[0] = Vector3D(1, 0, 0);
  sampleToWorld[1] = Vector3D(0, 0, -1);
  sampleToWorld[2] = Vector3D(0, 1, 0);
}